

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var __thiscall
Js::RegexHelper::RegexEs5ReplaceImpl
          (RegexHelper *this,ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
          JavascriptString *input,RecyclableObject *replacefn)

{
  size_t size;
  bool bVar1;
  byte bVar2;
  char16 c;
  RegexPattern *this_00;
  RecyclableObject *nonMatchValue;
  undefined8 uVar3;
  code *pcVar4;
  long lVar5;
  Type nValue;
  bool bVar6;
  bool isSticky;
  bool bVar7;
  uint16 uVar8;
  charcount_t inputLength;
  Attributes attributes;
  CharCount offset;
  char16 *input_00;
  undefined4 *puVar9;
  JavascriptString *pJVar10;
  GroupInfo GVar11;
  Var pvVar12;
  RecyclableObject *ptr;
  GroupInfo GVar13;
  JavascriptRegExp *pJVar14;
  charcount_t appendCharLength;
  CharCount appendCharLength_00;
  ulong uVar15;
  RegexPattern *extraout_RDX;
  RegexPattern *extraout_RDX_00;
  RegexPattern *pattern;
  RegexPattern *extraout_RDX_01;
  RegexPattern *extraout_RDX_02;
  RegexPattern *extraout_RDX_03;
  JavascriptLibrary *this_01;
  GroupInfo GVar16;
  int groupId;
  ulong uVar17;
  GroupInfo aGStack_320 [2];
  undefined8 uStack_310;
  undefined8 uStack_308;
  ulong auStack_300 [2];
  undefined1 local_2f0 [8];
  Builder<256U> concatenated;
  RegexMatchState state;
  ulong local_88;
  GroupInfo local_48;
  GroupInfo lastActualMatch;
  
  this_00 = (RegexPattern *)(scriptContext->super_ScriptContextBase).pActiveScriptDirect;
  auStack_300[0] = 0xbdf481;
  input_00 = JavascriptString::GetString((JavascriptString *)regularExpression);
  auStack_300[0] = 0xbdf48d;
  inputLength = JavascriptString::GetLength((JavascriptString *)regularExpression);
  auStack_300[0] = 0xbdf498;
  uVar8 = UnifiedRegex::RegexPattern::NumGroups(this_00);
  this_01 = *(JavascriptLibrary **)(this + 8);
  nonMatchValue = (this_01->super_JavascriptLibraryBase).undefinedValue.ptr;
  if ((short)uVar8 < 1) {
    AssertCount = AssertCount + 1;
    auStack_300[0] = 0xbdf4c9;
    Throw::LogAssert();
    auStack_300[0] = 0xbdf4d9;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    auStack_300[0] = 0xbdf501;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x502,"(0 < numGroups && numGroups <= (32767))",
                                "0 < numGroups && numGroups <= (32767)");
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
    this_01 = *(JavascriptLibrary **)(this + 8);
  }
  auStack_300[0] = 0xbdf530;
  pJVar10 = JavascriptLibrary::CreateStringFromCppLiteral<19ul>
                      (this_01,(char16 (*) [19])L"<replace function>");
  auStack_300[0] = 0xbdf542;
  RegexHelperTrace((ScriptContext *)this,(Use)scriptContext,regularExpression,pJVar10,
                   (JavascriptString *)replacefn);
  offset = 0;
  auStack_300[0] = 0xbdf563;
  PrimBeginMatch((RegexMatchState *)&concatenated.isFinalized,(ScriptContext *)this,this_00,input_00
                 ,(CharCount)replacefn,false);
  auStack_300[0] = 0xbdf56b;
  bVar6 = UnifiedRegex::RegexPattern::IsGlobal(this_00);
  auStack_300[0] = 0xbdf576;
  isSticky = UnifiedRegex::RegexPattern::IsSticky(this_00);
  if (bVar6) {
    scriptContext->next = (ScriptContext *)0x0;
    *(undefined4 *)&scriptContext->prev = 0;
  }
  else if (isSticky) {
    auStack_300[0] = 0xbdf5a4;
    offset = JavascriptRegExp::GetLastIndex((JavascriptRegExp *)scriptContext);
  }
  auStack_300[0] = 0xbdf5b7;
  CompoundString::Builder<256U>::Builder((Builder<256U> *)local_2f0,(ScriptContext *)this);
  local_48.offset = 0;
  local_48.length = 0xffffffff;
  lastActualMatch.offset = (uint)uVar8 * 8;
  lastActualMatch.length = 0;
  size = (long)lastActualMatch + 0x18;
  GVar16.offset = 0;
  GVar16.length = 0;
  auStack_300[0] = 0xbdf5eb;
  ThreadContext::ProbeStackNoDispose
            (*(ThreadContext **)(this + 0x3b8),size,(ScriptContext *)this,(PVOID)0x0);
  lVar5 = -(ulong)((int)size + 0xfU & 0x1ffff0);
  *(undefined8 *)((long)auStack_300 + lVar5 + 8) = *(undefined8 *)(*(long *)(this + 8) + 0x430);
  *(JavascriptRegExp **)((long)&concatenated + (long)lastActualMatch + lVar5) = regularExpression;
  pattern = extraout_RDX;
  if (offset != 0) {
    appendCharLength = inputLength;
    if (offset < inputLength) {
      appendCharLength = offset;
    }
    *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf63f;
    CompoundString::Builder<256U>::Append
              ((Builder<256U> *)local_2f0,(JavascriptString *)regularExpression,0,appendCharLength);
    pattern = extraout_RDX_00;
  }
  *(undefined8 *)((long)auStack_300 + lVar5) = 0xffffffffffffffff;
  local_88 = *(ulong *)((long)auStack_300 + lVar5);
  do {
    GVar13 = GVar16;
    if (inputLength < offset) {
      local_48.length = 0xffffffff;
      break;
    }
    *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf671;
    GVar11 = PrimMatch((RegexMatchState *)&concatenated.isFinalized,(ScriptContext *)this,this_00,
                       inputLength,offset);
    uVar15 = (ulong)GVar11 >> 0x20;
    pattern = (RegexPattern *)0xffffffff;
    local_48 = GVar11;
    if (uVar15 == 0xffffffff) break;
    for (uVar17 = 0; uVar8 != uVar17; uVar17 = uVar17 + 1) {
      *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf6b6;
      pvVar12 = GetGroup((ScriptContext *)this,this_00,(JavascriptString *)regularExpression,
                         nonMatchValue,(int)uVar17);
      *(Var *)((long)&concatenated + uVar17 * 8 + lVar5 + -8) = pvVar12;
    }
    nValue = local_48.offset;
    *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf6cf;
    pvVar12 = JavascriptNumber::ToVar(nValue,(ScriptContext *)this);
    *(Var *)((long)&concatenated + (ulong)uVar8 * 8 + lVar5 + -8) = pvVar12;
    GVar16 = *(GroupInfo *)(this + 0x3b8);
    bVar1 = *(bool *)((long)GVar16 + 0x109);
    *(bool *)((long)GVar16 + 0x109) = true;
    state.matcher = (Matcher *)input;
    lastActualMatch = GVar16;
    *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf717;
    attributes = FunctionInfo::GetAttributes(&input->super_RecyclableObject);
    *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf727;
    bVar7 = ThreadContext::HasNoSideEffect
                      ((ThreadContext *)GVar16,&input->super_RecyclableObject,attributes);
    GVar16 = lastActualMatch;
    if (bVar7) {
      *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf737;
      ptr = (RecyclableObject *)
            RegexEs5ReplaceImpl::anon_class_24_3_7db8a28a::operator()
                      ((anon_class_24_3_7db8a28a *)&state.matcher);
      *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf746;
      bVar7 = ThreadContext::IsOnStack(ptr);
LAB_00bdf746:
      GVar16 = lastActualMatch;
      if (bVar7 != false) {
        *(byte *)((long)lastActualMatch + 0x1570) = *(byte *)((long)lastActualMatch + 0x1570) | 5;
      }
    }
    else if ((*(byte *)((long)lastActualMatch + 0x1542) & 1) == 0) {
      if ((attributes & HasNoSideEffect) != None) {
        *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf879;
        ptr = (RecyclableObject *)
              RegexEs5ReplaceImpl::anon_class_24_3_7db8a28a::operator()
                        ((anon_class_24_3_7db8a28a *)&state.matcher);
        *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf884;
        bVar7 = ThreadContext::IsOnStack(ptr);
        goto LAB_00bdf746;
      }
      bVar2 = *(byte *)((long)lastActualMatch + 0x1570);
      *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf791;
      ptr = (RecyclableObject *)
            RegexEs5ReplaceImpl::anon_class_24_3_7db8a28a::operator()
                      ((anon_class_24_3_7db8a28a *)&state.matcher);
      *(byte *)((long)GVar16 + 0x1570) = bVar2 | 5;
    }
    else {
      *(byte *)((long)lastActualMatch + 0x1570) = *(byte *)((long)lastActualMatch + 0x1570) | 5;
      ptr = (((((((((input->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
             javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    *(bool *)((long)GVar16 + 0x109) = bVar1;
    *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf7ea;
    pJVar10 = JavascriptConversion::ToString(ptr,(ScriptContext *)this);
    appendCharLength_00 = local_48.offset - offset;
    *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf809;
    CompoundString::Builder<256U>::Append
              ((Builder<256U> *)local_2f0,(JavascriptString *)regularExpression,offset,
               appendCharLength_00);
    *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf814;
    CompoundString::Builder<256U>::Append((Builder<256U> *)local_2f0,pJVar10);
    if (local_48.length == 0) {
      pattern = extraout_RDX_01;
      if (local_48.offset < inputLength) {
        c = input_00[(ulong)local_48 & 0xffffffff];
        *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf850;
        CompoundString::Builder<256U>::Append((Builder<256U> *)local_2f0,c);
        pattern = extraout_RDX_03;
      }
      offset = local_48.offset + 1;
    }
    else {
      *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf823;
      offset = UnifiedRegex::GroupInfo::EndOffset(&local_48);
      pattern = extraout_RDX_02;
    }
    GVar16 = (GroupInfo)((ulong)GVar11 & 0xffffffff);
    GVar13 = GVar11;
    local_88 = uVar15;
  } while (bVar6);
  *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf8b2;
  PrimEndMatch((RegexMatchState *)&concatenated.isFinalized,(ScriptContext *)this,pattern);
  pJVar14 = regularExpression;
  if (offset != 0) {
    if (offset <= inputLength && inputLength - offset != 0) {
      *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf8da;
      CompoundString::Builder<256U>::Append
                ((Builder<256U> *)local_2f0,(JavascriptString *)regularExpression,offset,
                 inputLength - offset);
    }
    *(undefined8 *)((long)auStack_300 + lVar5) = 0xbdf8e6;
    pJVar14 = (JavascriptRegExp *)
              CompoundString::Builder<256U>::ToString((Builder<256U> *)local_2f0);
  }
  *(undefined8 *)((long)auStack_300 + lVar5) = 1;
  uVar3 = *(undefined8 *)((long)auStack_300 + lVar5);
  *(undefined8 *)((long)auStack_300 + lVar5) = 0;
  *(undefined8 *)((long)&uStack_308 + lVar5) = uVar3;
  *(undefined8 *)((long)&uStack_310 + lVar5) = uVar3;
  *(GroupInfo *)((long)aGStack_320 + lVar5 + 8) = local_48;
  *(undefined8 *)((long)aGStack_320 + lVar5) = 0xbdf917;
  PropagateLastMatch((ScriptContext *)this,bVar6,isSticky,(JavascriptRegExp *)scriptContext,
                     (JavascriptString *)regularExpression,
                     (GroupInfo)((ulong)GVar13 & 0xffffffff | local_88 << 0x20),
                     *(GroupInfo *)((long)aGStack_320 + lVar5 + 8),
                     *(bool *)((long)&uStack_310 + lVar5),*(bool *)((long)&uStack_308 + lVar5),
                     *(bool *)((long)auStack_300 + lVar5));
  return pJVar14;
}

Assistant:

Var RegexHelper::RegexEs5ReplaceImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, RecyclableObject* replacefn)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        JavascriptString* newString = nullptr;
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();
        const uint16 numGroups = pattern->NumGroups();
        Var nonMatchValue = NonMatchValue(scriptContext, false);
        UnifiedRegex::GroupInfo lastMatch; // initially undefined

        // Regex parser should ensure this condition holds, but let's be doubly sure.
        // numGroups is always positive because the entire regex counts as a capturing group.
        AssertOrFailFast(0 < numGroups && numGroups <= INT16_MAX);

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Replace, regularExpression, input, scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("<replace function>")));
#endif

        RegexMatchState state;
        PrimBeginMatch(state, scriptContext, pattern, inputStr, inputLength, false);

        // NOTE: These must be kept out of the scope of the try below!
        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();

        // If global = true, set lastIndex to 0 in case it is used in replacefn
        if (isGlobal)
        {
            regularExpression->SetLastIndex(0);
        }

        // If global = false and sticky = true, set offset = lastIndex, else set offset = 0
        CharCount offset = 0;
        if (!isGlobal && isSticky)
        {
            offset = regularExpression->GetLastIndex();
        }

        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> concatenated(scriptContext);
        UnifiedRegex::GroupInfo lastActualMatch;
        UnifiedRegex::GroupInfo lastSuccessfulMatch;

        // Replace function must be called with arguments (<function's this>, group0, ..., groupn, offset, input)
        // The garbage collector must know about this array since it is being passed back into script land
        Var* replaceArgs;
        PROBE_STACK_NO_DISPOSE(scriptContext, (numGroups + 3) * sizeof(Var));
        replaceArgs = (Var*)_alloca((numGroups + 3) * sizeof(Var));
        replaceArgs[0] = scriptContext->GetLibrary()->GetUndefined();
        replaceArgs[numGroups + 2] = input;

        if (offset > 0)
        {
            concatenated.Append(input, 0, min(offset, inputLength));
        }

        do
        {
            if (offset > inputLength)
            {
                lastActualMatch.Reset();
                break;
            }

            lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

            if (lastActualMatch.IsUndefined())
                break;

            lastSuccessfulMatch = lastActualMatch;
            for (int groupId = 0;  groupId < numGroups; groupId++)
                replaceArgs[groupId + 1] = GetGroup(scriptContext, pattern, input, nonMatchValue, groupId);
            replaceArgs[numGroups + 1] = JavascriptNumber::ToVar(lastActualMatch.offset, scriptContext);

            // The called function must see the global state updated by the current match
            // (Should the function reach into a RegExp field, the pattern will still be valid, thus there's no
            //  danger of the primitive regex matcher being re-entered)

            // WARNING: We go off into script land here, which way in turn invoke a regex operation, even on the
            //          same regex.

            ThreadContext* threadContext = scriptContext->GetThreadContext();
            Var replaceVar = threadContext->ExecuteImplicitCall(replacefn, ImplicitCall_Accessor, [=]()->Js::Var
            {
                    return JavascriptFunction::CallFunction<true>(replacefn, replacefn->GetEntryPoint(), Arguments(CallInfo(UInt16Math::Add(numGroups, 3)), replaceArgs));
            });
            JavascriptString* replace = JavascriptConversion::ToString(replaceVar, scriptContext);
            concatenated.Append(input, offset, lastActualMatch.offset - offset);
            concatenated.Append(replace);

            if (lastActualMatch.length == 0)
            {
                if (lastActualMatch.offset < inputLength)
                {
                    concatenated.Append(inputStr[lastActualMatch.offset]);
                }
                offset = lastActualMatch.offset + 1;
            }
            else
            {
                offset = lastActualMatch.EndOffset();
            }
        }
        while (isGlobal);

        PrimEndMatch(state, scriptContext, pattern);

        if (offset == 0)
        {
            // There was no successful match so the result is the input string.
            newString = input;
        }
        else
        {
            if (offset < inputLength)
            {
                concatenated.Append(input, offset, inputLength - offset);
            }
            newString = concatenated.ToString();
        }

        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
        return newString;
    }